

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,duckdb::uhugeint_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  const_reference pvVar7;
  idx_t iVar8;
  uint uVar9;
  SelectionVector *pSVar10;
  idx_t iVar11;
  idx_t iVar12;
  uchar **rhs_locations;
  data_ptr_t pdVar13;
  idx_t iVar14;
  bool bVar15;
  SelectionVector *lhs_sel;
  uhugeint_t local_48;
  data_ptr_t local_38;
  
  puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar3 = (lhs_format->unified).sel;
  pdVar4 = (lhs_format->unified).data;
  pdVar13 = rhs_row_locations->data;
  pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar7;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar14 = 0;
      iVar12 = 0;
      do {
        iVar11 = iVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar12];
        }
        psVar6 = pSVar3->sel_vector;
        iVar8 = iVar11;
        if (psVar6 != (sel_t *)0x0) {
          iVar8 = (idx_t)psVar6[iVar11];
        }
        puVar1 = (uint64_t *)(*(long *)(pdVar13 + iVar11 * 8) + vVar5);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        bVar15 = (1 << ((byte)col_idx & 7) &
                 (uint)*(byte *)(*(long *)(pdVar13 + iVar11 * 8) + (col_idx >> 3))) != 0;
        if (bVar15) {
          bVar15 = uhugeint_t::operator==((uhugeint_t *)(pdVar4 + iVar8 * 0x10),&local_48);
        }
        if (bVar15 == false) {
          iVar8 = *no_match_count;
          *no_match_count = iVar8 + 1;
          pSVar10 = no_match_sel;
        }
        else {
          iVar8 = iVar14;
          pSVar10 = sel;
          iVar14 = iVar14 + 1;
        }
        pSVar10->sel_vector[iVar8] = (sel_t)iVar11;
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return iVar14;
    }
  }
  else if (count != 0) {
    iVar14 = 0;
    iVar12 = 0;
    local_38 = pdVar13;
    do {
      iVar11 = iVar12;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)sel->sel_vector[iVar12];
      }
      psVar6 = pSVar3->sel_vector;
      iVar8 = iVar11;
      if (psVar6 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar6[iVar11];
      }
      puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar15 = false;
      }
      else {
        bVar15 = (puVar2[iVar8 >> 6] >> (iVar8 & 0x3f) & 1) == 0;
      }
      uVar9 = (uint)*(byte *)(*(long *)(pdVar13 + iVar11 * 8) + (col_idx >> 3)) &
              1 << ((byte)col_idx & 7);
      puVar1 = (uint64_t *)(*(long *)(pdVar13 + iVar11 * 8) + vVar5);
      local_48.lower = *puVar1;
      local_48.upper = puVar1[1];
      if ((bVar15 == false) && (uVar9 != 0)) {
        bVar15 = uhugeint_t::operator==((uhugeint_t *)(pdVar4 + iVar8 * 0x10),&local_48);
        pdVar13 = local_38;
      }
      else {
        bVar15 = (bool)(bVar15 ^ uVar9 == 0 ^ 1);
      }
      if (bVar15 == false) {
        iVar8 = *no_match_count;
        *no_match_count = iVar8 + 1;
        pSVar10 = no_match_sel;
      }
      else {
        iVar8 = iVar14;
        pSVar10 = sel;
        iVar14 = iVar14 + 1;
      }
      pSVar10->sel_vector[iVar8] = (sel_t)iVar11;
      iVar12 = iVar12 + 1;
    } while (count != iVar12);
    return iVar14;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}